

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O3

void Opa_ManMoveOne(Opa_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanin)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Gia_Man_t *pGVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  long lVar11;
  
  pGVar3 = p->pGia->pObjs;
  if ((((pObj < pGVar3) || (pGVar3 + p->pGia->nObjs <= pObj)) || (pFanin < pGVar3)) ||
     (pGVar3 + p->pGia->nObjs <= pFanin)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar10 = (int)((long)pFanin - (long)pGVar3 >> 2) * -0x55555555;
  if (iVar10 != 0) {
    iVar8 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
    piVar4 = p->pId2Part;
    iVar1 = piVar4[iVar8];
    lVar7 = (long)iVar1;
    if (lVar7 < 0) {
      __assert_fail("p->pId2Part[ iObj ] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCone.c"
                    ,0x88,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    iVar2 = piVar4[iVar10];
    if ((long)iVar2 == -1) {
      piVar4[iVar10] = iVar1;
      Vec_IntPush(p->pvParts + piVar4[iVar8],iVar10);
      uVar6 = (uint)*(undefined8 *)pFanin;
      if ((~uVar6 & 0x9fffffff) == 0) {
        pGVar5 = p->pGia;
        uVar6 = (uint)((ulong)*(undefined8 *)pFanin >> 0x20) & 0x1fffffff;
        iVar10 = pGVar5->vCis->nSize;
        if ((int)uVar6 < iVar10 - pGVar5->nRegs) {
          return;
        }
        iVar1 = pGVar5->vCos->nSize;
        uVar6 = (iVar1 - iVar10) + uVar6;
        if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = pGVar5->vCos->pArray[uVar6];
        lVar7 = (long)iVar10;
        if ((lVar7 < 0) || (pGVar5->nObjs <= iVar10)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        piVar4 = p->pId2Part;
        if (piVar4[lVar7] != -1) {
          __assert_fail("p->pId2Part[ iFanin ] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCone.c"
                        ,0x94,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
        }
        iVar1 = piVar4[iVar8];
        piVar4[lVar7] = iVar1;
        Vec_IntPush(p->pvParts + iVar1,iVar10);
        pVVar9 = p->vFront;
      }
      else {
        if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsCi(pFanin) || Gia_ObjIsAnd(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCone.c"
                        ,0x8d,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
        }
        pVVar9 = p->vFront;
      }
      Vec_IntPush(pVVar9,iVar10);
      return;
    }
    if (iVar1 != iVar2) {
      pVVar9 = p->pvParts;
      if (pVVar9[lVar7].nSize < 1) {
        __assert_fail("Vec_IntSize(vPartObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCone.c"
                      ,0xa1,"void Opa_ManMoveOne(Opa_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
      }
      lVar11 = 0;
      do {
        iVar1 = pVVar9[lVar7].pArray[lVar11];
        Vec_IntPush(pVVar9 + iVar2,iVar1);
        p->pId2Part[iVar1] = p->pId2Part[iVar10];
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar9[lVar7].nSize);
      if (pVVar9[lVar7].nSize < 0) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      pVVar9[lVar7].nSize = 0;
      p->nParts = p->nParts + -1;
    }
  }
  return;
}

Assistant:

void Opa_ManMoveOne( Opa_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanin )
{
    int iObj   = Gia_ObjId(p->pGia, pObj);
    int iFanin = Gia_ObjId(p->pGia, pFanin);
    if ( iFanin == 0 )
        return;
    assert( p->pId2Part[ iObj ] >= 0 );
    if ( p->pId2Part[ iFanin ] == -1 )
    {
        p->pId2Part[ iFanin ] = p->pId2Part[ iObj ];
        Vec_IntPush( p->pvParts + p->pId2Part[ iObj ], iFanin );
        assert( Gia_ObjIsCi(pFanin) || Gia_ObjIsAnd(pFanin) );
        if ( Gia_ObjIsAnd(pFanin) )
            Vec_IntPush( p->vFront, iFanin );
        else if ( Gia_ObjIsRo(p->pGia, pFanin) )
        {
            pFanin = Gia_ObjRoToRi(p->pGia, pFanin);
            iFanin = Gia_ObjId(p->pGia, pFanin);
            assert( p->pId2Part[ iFanin ] == -1 );
            p->pId2Part[ iFanin ] = p->pId2Part[ iObj ];
            Vec_IntPush( p->pvParts + p->pId2Part[ iObj ], iFanin );
            Vec_IntPush( p->vFront, iFanin );
        }
    }
    else if ( p->pId2Part[ iObj ] != p->pId2Part[ iFanin ] )
    {
        Vec_Int_t * vPartObj = p->pvParts + p->pId2Part[ iObj ];
        Vec_Int_t * vPartFan = p->pvParts + p->pId2Part[ iFanin ];
        int iTemp, i;
//        printf( "Moving %d to %d (%d -> %d)\n", iObj, iFanin, Vec_IntSize(vPartObj), Vec_IntSize(vPartFan) );
        // add group of iObj to group of iFanin
        assert( Vec_IntSize(vPartObj) > 0 );
        Vec_IntForEachEntry( vPartObj, iTemp, i )
        {
            Vec_IntPush( vPartFan, iTemp );
            p->pId2Part[ iTemp ] = p->pId2Part[ iFanin ];
        }
        Vec_IntShrink( vPartObj, 0 );
        p->nParts--;
    }
}